

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

char * Qiniu_String_Concat(char *s1,...)

{
  char in_AL;
  size_t sVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined8 *local_138;
  undefined8 *local_120;
  undefined1 local_108 [8];
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  size_t local_50;
  size_t len1;
  size_t slen;
  size_t len;
  char *s;
  char *p;
  va_list ap;
  char *s1_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  local_100 = in_RSI;
  local_f8 = in_RDX;
  local_f0 = in_RCX;
  local_e8 = in_R8;
  local_e0 = in_R9;
  ap[0].reg_save_area = s1;
  local_50 = strlen(s1);
  ap[0].overflow_arg_area = local_108;
  ap[0]._0_8_ = &stack0x00000008;
  p._4_4_ = 0x30;
  p._0_4_ = 8;
  slen = local_50;
  while( true ) {
    if ((uint)p < 0x29) {
      local_120 = (undefined8 *)((long)(int)(uint)p + (long)ap[0].overflow_arg_area);
      p._0_4_ = (uint)p + 8;
    }
    else {
      local_120 = (undefined8 *)ap[0]._0_8_;
      ap[0]._0_8_ = ap[0]._0_8_ + 8;
    }
    len = *local_120;
    if ((char *)len == (char *)0x0) break;
    sVar1 = strlen((char *)len);
    slen = sVar1 + slen;
  }
  s = (char *)malloc(slen + 1);
  ap[0].overflow_arg_area = local_108;
  ap[0]._0_8_ = &stack0x00000008;
  p._4_4_ = 0x30;
  p._0_4_ = 8;
  memcpy(s,ap[0].reg_save_area,local_50);
  slen = local_50;
  while( true ) {
    if ((uint)p < 0x29) {
      local_138 = (undefined8 *)((long)(int)(uint)p + (long)ap[0].overflow_arg_area);
      p._0_4_ = (uint)p + 8;
    }
    else {
      local_138 = (undefined8 *)ap[0]._0_8_;
      ap[0]._0_8_ = ap[0]._0_8_ + 8;
    }
    len = *local_138;
    if ((char *)len == (char *)0x0) break;
    len1 = strlen((char *)len);
    memcpy(s + slen,(void *)len,len1);
    slen = len1 + slen;
  }
  s[slen] = '\0';
  return s;
}

Assistant:

char *Qiniu_String_Concat(const char *s1, ...)
{
	va_list ap;
	char *p;
	const char *s;
	size_t len, slen, len1 = strlen(s1);

	va_start(ap, s1);
	len = len1;
	for (;;)
	{
		s = va_arg(ap, const char *);
		if (s == NULL)
		{
			break;
		}
		len += strlen(s);
	}

	p = (char *)malloc(len + 1);

	va_start(ap, s1);
	memcpy(p, s1, len1);
	len = len1;
	for (;;)
	{
		s = va_arg(ap, const char *);
		if (s == NULL)
		{
			break;
		}
		slen = strlen(s);
		memcpy(p + len, s, slen);
		len += slen;
	}
	p[len] = '\0';
	return p;
}